

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
dynet::LogSoftmax::backward_dev_impl<dynet::Device_CPU>
          (LogSoftmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor *pTVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  runtime_error *this_00;
  float *pfVar8;
  array<long,_1> numValuesToReduce;
  ulong uVar9;
  int iVar10;
  array<long,_1> aVar11;
  type **pptVar12;
  _Type alVar13;
  Index IVar14;
  long lVar15;
  float *pfVar16;
  ushort uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  uint uVar48;
  CoeffReturnType CVar49;
  uint uVar50;
  type local_160;
  int local_148 [7];
  uint local_12c;
  uint local_128;
  _Type local_120;
  undefined1 local_118 [16];
  pointer local_108;
  Device *local_100;
  undefined4 local_f8;
  Device_CPU *local_f0;
  type *local_e8;
  _Type alStack_e0;
  DefaultDevice *local_d8;
  float *local_d0;
  array<Index,_NumPreservedStrides> local_c8;
  type *local_c0;
  _Type local_b8;
  array<Index,_NumReducedDims> local_b0;
  array<Index,_NumReducedDims> local_a8;
  DefaultDevice *local_a0;
  float *local_98;
  float *local_90;
  Dimensions local_88;
  DefaultDevice *local_80;
  float *local_78;
  Dimensions local_70;
  DefaultDevice *local_68;
  EvaluatorPointerType local_58;
  DefaultDevice *local_50;
  type local_40;
  
  pTVar1 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((1 < (pTVar1->d).nd) && ((pTVar1->d).d[1] != 1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"LogSoftmax::backward not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_120[0] = (long)(this->super_Node).aux_mem;
  local_128 = (fx->d).bd;
  local_148[0] = 1;
  local_12c = 1;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = fx->device;
  local_f8 = 0;
  if ((DefaultDevice *)(long)(int)local_128 != (DefaultDevice *)0x1) {
    uVar48 = (fx->d).nd;
    if ((ulong)uVar48 == 0) {
      lVar15 = 1;
      if ((fx->d).d[0] != 1) goto LAB_0034cb8a;
    }
    else {
      if (uVar48 == 1) {
        uVar48 = (fx->d).d[0];
      }
      else {
        auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar29 = vpbroadcastq_avx512f();
        uVar9 = 0;
        do {
          auVar30 = vpbroadcastq_avx512f();
          auVar31 = vmovdqa64_avx512f(auVar26);
          auVar26 = vporq_avx512f(auVar30,auVar27);
          auVar30 = vporq_avx512f(auVar30,auVar28);
          uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
          bVar7 = (byte)uVar5;
          uVar17 = CONCAT11(bVar7,bVar6);
          auVar30 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar9));
          auVar26._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar30._4_4_;
          auVar26._0_4_ = (uint)(bVar6 & 1) * auVar30._0_4_;
          auVar26._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar30._8_4_;
          auVar26._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar30._12_4_;
          auVar26._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar30._16_4_;
          auVar26._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar30._20_4_;
          auVar26._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar30._24_4_;
          auVar26._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar30._28_4_;
          auVar26._32_4_ = (uint)(bVar7 & 1) * auVar30._32_4_;
          auVar26._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar30._36_4_;
          auVar26._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar30._40_4_;
          auVar26._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar30._44_4_;
          auVar26._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar30._48_4_;
          auVar26._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar30._52_4_;
          auVar26._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar30._56_4_;
          auVar26._60_4_ = (uint)(bVar7 >> 7) * auVar30._60_4_;
          uVar9 = uVar9 + 0x10;
          auVar26 = vpmulld_avx512f(auVar26,auVar31);
        } while (((ulong)uVar48 + 0xf & 0x1fffffff0) != uVar9);
        auVar26 = vmovdqa32_avx512f(auVar26);
        auVar27._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_
        ;
        bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar27._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
        bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar27._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
        bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar27._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
        bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar27._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
        bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar27._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
        bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar27._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
        bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar27._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
        auVar27._32_4_ =
             (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar27._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar27._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar27._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar27._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar27._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar27._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
        auVar27._60_4_ =
             (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
        auVar18 = vextracti64x4_avx512f(auVar27,1);
        auVar26 = vpmulld_avx512f(auVar27,ZEXT3264(auVar18));
        auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        uVar48 = auVar3._0_4_;
        if (uVar48 != (fx->d).d[0]) goto LAB_0034cb8a;
      }
      lVar15 = (long)(int)uVar48;
    }
    uVar48 = (dEdf->d).nd;
    if ((ulong)uVar48 == 0) {
      alVar13[0] = 1;
      if ((dEdf->d).d[0] != 1) goto LAB_0034cb8a;
    }
    else {
      if (uVar48 == 1) {
        uVar48 = (dEdf->d).d[0];
      }
      else {
        auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar29 = vpbroadcastq_avx512f();
        uVar9 = 0;
        do {
          auVar30 = vpbroadcastq_avx512f();
          auVar31 = vmovdqa64_avx512f(auVar26);
          auVar26 = vporq_avx512f(auVar30,auVar27);
          auVar30 = vporq_avx512f(auVar30,auVar28);
          uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
          bVar7 = (byte)uVar5;
          uVar17 = CONCAT11(bVar7,bVar6);
          auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar9));
          auVar30._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
          auVar30._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
          auVar30._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
          auVar30._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
          auVar30._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
          auVar30._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
          auVar30._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
          auVar30._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
          auVar30._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
          auVar30._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
          auVar30._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
          auVar30._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
          auVar30._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
          auVar30._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
          auVar30._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
          auVar30._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
          uVar9 = uVar9 + 0x10;
          auVar26 = vpmulld_avx512f(auVar30,auVar31);
        } while (((ulong)uVar48 + 0xf & 0x1fffffff0) != uVar9);
        auVar26 = vmovdqa32_avx512f(auVar26);
        auVar28._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_
        ;
        bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar28._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
        bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar28._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
        bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar28._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
        bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar28._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
        bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar28._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
        bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar28._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
        bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar28._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
        auVar28._32_4_ =
             (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar28._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar28._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar28._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar28._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar28._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar28._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
        auVar28._60_4_ =
             (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
        auVar18 = vextracti64x4_avx512f(auVar28,1);
        auVar26 = vpmulld_avx512f(auVar28,ZEXT3264(auVar18));
        auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        uVar48 = auVar3._0_4_;
        if (uVar48 != (dEdf->d).d[0]) goto LAB_0034cb8a;
      }
      alVar13[0] = (long)(int)uVar48;
    }
    local_e8 = (type *)fx->v;
    alStack_e0[0] = lVar15;
    local_d8 = (DefaultDevice *)(long)(int)local_128;
    local_d0 = dEdf->v;
    local_c8._M_elems[0] = (_Type)(_Type)alVar13[0];
    local_c0 = (type *)(long)(int)(dEdf->d).bd;
    local_b0._M_elems[0] = (_Type)((ulong)local_b0._M_elems[0] & 0xffffffff00000000);
    auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = vpbroadcastq_avx512f();
    lVar15 = 0;
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vmovdqa64_avx512f(auVar26);
      auVar26 = vporq_avx512f(auVar30,auVar27);
      auVar30 = vporq_avx512f(auVar30,auVar28);
      uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
      bVar7 = (byte)uVar5;
      uVar17 = CONCAT11(bVar7,bVar6);
      auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_148 + lVar15));
      auVar21._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
      auVar21._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
      auVar21._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
      auVar21._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
      auVar21._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
      auVar21._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
      auVar21._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
      auVar21._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
      auVar21._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
      auVar21._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
      auVar21._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
      auVar21._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
      auVar21._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
      auVar21._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
      auVar21._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
      auVar21._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
      lVar15 = lVar15 + 0x10;
      auVar26 = vpmulld_avx512f(auVar21,auVar31);
    } while (lVar15 != 0x10);
    auVar26 = vmovdqa32_avx512f(auVar26);
    auVar29._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_;
    bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar29._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
    bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar29._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
    bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar29._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
    bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar29._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
    bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar29._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
    bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar29._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
    bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
    auVar29._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
    auVar29._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar29._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar29._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar29._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar29._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar29._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar29._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
    auVar29._60_4_ =
         (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
    auVar18 = vextracti64x4_avx512f(auVar29,1);
    auVar26 = vpmulld_avx512f(auVar29,ZEXT3264(auVar18));
    auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    if (auVar3._0_4_ != 1) {
      __assert_fail("d.batch_size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                    ,0xe4,"Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::tb()");
    }
    local_40.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)(long)(int)local_128;
    local_160.m_data = (StoragePointerType)&local_40;
    local_160.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_e8;
    local_f0 = dev;
    local_40.m_data = (StoragePointerType)local_120[0];
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>_>,_Eigen::DefaultDevice,_false,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>_>
           *)&local_160,dev->edevice);
    uVar48 = (fx->d).d[0];
    alVar13[0] = (long)(int)uVar48;
    uVar50 = (fx->d).nd;
    if ((ulong)uVar50 == 0) {
      alVar13[0] = 1;
      if (uVar48 != 1) goto LAB_0034cb8a;
    }
    else if (uVar50 != 1) {
      auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar29 = vpbroadcastq_avx512f();
      uVar9 = 0;
      do {
        auVar30 = vpbroadcastq_avx512f();
        auVar31 = vmovdqa64_avx512f(auVar26);
        auVar26 = vporq_avx512f(auVar30,auVar27);
        auVar30 = vporq_avx512f(auVar30,auVar28);
        uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
        bVar6 = (byte)uVar5;
        uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
        bVar7 = (byte)uVar5;
        uVar17 = CONCAT11(bVar7,bVar6);
        auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar9));
        auVar22._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
        auVar22._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
        auVar22._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
        auVar22._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
        auVar22._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
        auVar22._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
        auVar22._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
        auVar22._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
        auVar22._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
        auVar22._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
        auVar22._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
        auVar22._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
        auVar22._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
        auVar22._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
        auVar22._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
        auVar22._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
        uVar9 = uVar9 + 0x10;
        auVar26 = vpmulld_avx512f(auVar22,auVar31);
      } while (((ulong)uVar50 + 0xf & 0x1fffffff0) != uVar9);
      auVar26 = vmovdqa32_avx512f(auVar26);
      auVar23._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_;
      bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
      bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
      bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
      bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
      auVar23._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
      bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
      auVar23._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
      bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
      auVar23._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
      bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
      auVar23._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
      auVar23._32_4_ =
           (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
      bVar2 = (bool)(bVar7 >> 1 & 1);
      auVar23._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
      bVar2 = (bool)(bVar7 >> 2 & 1);
      auVar23._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
      bVar2 = (bool)(bVar7 >> 3 & 1);
      auVar23._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
      bVar2 = (bool)(bVar7 >> 4 & 1);
      auVar23._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
      bVar2 = (bool)(bVar7 >> 5 & 1);
      auVar23._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
      bVar2 = (bool)(bVar7 >> 6 & 1);
      auVar23._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
      auVar23._60_4_ =
           (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
      auVar18 = vextracti64x4_avx512f(auVar23,1);
      auVar26 = vpmulld_avx512f(auVar23,ZEXT3264(auVar18));
      auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      auVar4 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      if (auVar3._0_4_ != uVar48) goto LAB_0034cb8a;
    }
    if ((ulong)local_12c == 0) {
      local_a8._M_elems[0] = (_Type)1;
      if (local_148[0] != 1) goto LAB_0034cc00;
    }
    else {
      iVar10 = local_148[0];
      if (local_12c != 1) {
        auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar29 = vpbroadcastq_avx512f();
        uVar9 = 0;
        do {
          auVar30 = vpbroadcastq_avx512f();
          auVar31 = vmovdqa64_avx512f(auVar26);
          auVar26 = vporq_avx512f(auVar30,auVar27);
          auVar30 = vporq_avx512f(auVar30,auVar28);
          uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
          bVar7 = (byte)uVar5;
          uVar17 = CONCAT11(bVar7,bVar6);
          auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_148 + uVar9));
          auVar36._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
          auVar36._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
          auVar36._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
          auVar36._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
          auVar36._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
          auVar36._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
          auVar36._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
          auVar36._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
          auVar36._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
          auVar36._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
          auVar36._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
          auVar36._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
          auVar36._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
          auVar36._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
          auVar36._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
          auVar36._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
          uVar9 = uVar9 + 0x10;
          auVar26 = vpmulld_avx512f(auVar36,auVar31);
        } while (((ulong)local_12c + 0xf & 0x1fffffff0) != uVar9);
        auVar26 = vmovdqa32_avx512f(auVar26);
        auVar37._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_
        ;
        bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar37._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
        bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar37._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
        bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar37._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
        bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar37._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
        bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar37._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
        bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar37._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
        bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar37._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
        auVar37._32_4_ =
             (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar37._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar37._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar37._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar37._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar37._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar37._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
        auVar37._60_4_ =
             (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
        auVar18 = vextracti64x4_avx512f(auVar37,1);
        auVar26 = vpmulld_avx512f(auVar37,ZEXT3264(auVar18));
        auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        iVar10 = auVar3._0_4_;
        if (auVar3._0_4_ != local_148[0]) goto LAB_0034cc00;
      }
      local_a8._M_elems[0] = (_Type)(long)iVar10;
    }
    local_a0 = (DefaultDevice *)(long)(int)local_128;
    uVar50 = (dEdf->d).nd;
    if ((ulong)uVar50 == 0) {
      local_78 = (float *)0x1;
      if ((dEdf->d).d[0] != 1) {
LAB_0034cb8a:
        __assert_fail("d.ndims() == 1 || d.batch_size() == d.rows()",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                      ,0xf0,
                      "const Eigen::TensorMap<Eigen::Tensor<float, 2>> dynet::Tensor::tb() const");
      }
    }
    else {
      if (uVar50 == 1) {
        uVar50 = (dEdf->d).d[0];
      }
      else {
        auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar29 = vpbroadcastq_avx512f();
        uVar9 = 0;
        do {
          auVar30 = vpbroadcastq_avx512f();
          auVar31 = vmovdqa64_avx512f(auVar26);
          auVar26 = vporq_avx512f(auVar30,auVar27);
          auVar30 = vporq_avx512f(auVar30,auVar28);
          uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
          bVar7 = (byte)uVar5;
          uVar17 = CONCAT11(bVar7,bVar6);
          auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar9));
          auVar38._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
          auVar38._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
          auVar38._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
          auVar38._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
          auVar38._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
          auVar38._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
          auVar38._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
          auVar38._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
          auVar38._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
          auVar38._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
          auVar38._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
          auVar38._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
          auVar38._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
          auVar38._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
          auVar38._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
          auVar38._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
          uVar9 = uVar9 + 0x10;
          auVar26 = vpmulld_avx512f(auVar38,auVar31);
        } while (((ulong)uVar50 + 0xf & 0x1fffffff0) != uVar9);
        auVar26 = vmovdqa32_avx512f(auVar26);
        auVar39._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_
        ;
        bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar39._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
        bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar39._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
        bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar39._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
        bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar39._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
        bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar39._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
        bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar39._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
        bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar39._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
        auVar39._32_4_ =
             (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar39._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar39._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar39._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar39._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar39._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar39._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
        auVar39._60_4_ =
             (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
        auVar18 = vextracti64x4_avx512f(auVar39,1);
        auVar26 = vpmulld_avx512f(auVar39,ZEXT3264(auVar18));
        auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        uVar50 = auVar3._0_4_;
        if (uVar50 != (dEdf->d).d[0]) goto LAB_0034cb8a;
      }
      local_78 = (float *)(long)(int)uVar50;
    }
    local_80 = (DefaultDevice *)dEdf->v;
    local_70.super_array<long,_1>._M_elems[0] = (array<long,_1>)(long)(int)(dEdf->d).bd;
    uVar50 = (dEdxi->d).nd;
    if ((ulong)uVar50 == 0) {
      pptVar12 = (type **)0x1;
      if ((dEdxi->d).d[0] != 1) {
LAB_0034cc00:
        __assert_fail("d.ndims() == 1 || d.batch_size() == d.rows()",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                      ,0xec,"Eigen::TensorMap<Eigen::Tensor<float, 2>> dynet::Tensor::tb()");
      }
    }
    else {
      if (uVar50 == 1) {
        uVar50 = (dEdxi->d).d[0];
      }
      else {
        auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar29 = vpbroadcastq_avx512f();
        uVar9 = 0;
        do {
          auVar30 = vpbroadcastq_avx512f();
          auVar31 = vmovdqa64_avx512f(auVar26);
          auVar26 = vporq_avx512f(auVar30,auVar27);
          auVar30 = vporq_avx512f(auVar30,auVar28);
          uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
          bVar7 = (byte)uVar5;
          uVar17 = CONCAT11(bVar7,bVar6);
          auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar9));
          auVar40._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
          auVar40._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
          auVar40._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
          auVar40._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
          auVar40._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
          auVar40._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
          auVar40._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
          auVar40._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
          auVar40._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
          auVar40._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
          auVar40._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
          auVar40._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
          auVar40._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
          auVar40._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
          auVar40._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
          auVar40._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
          uVar9 = uVar9 + 0x10;
          auVar26 = vpmulld_avx512f(auVar40,auVar31);
        } while (((ulong)uVar50 + 0xf & 0x1fffffff0) != uVar9);
        auVar26 = vmovdqa32_avx512f(auVar26);
        auVar41._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_
        ;
        bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
        bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
        bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
        bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
        bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
        bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
        bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar41._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
        auVar41._32_4_ =
             (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar41._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar41._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar41._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar41._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar41._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar41._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
        auVar41._60_4_ =
             (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
        auVar18 = vextracti64x4_avx512f(auVar41,1);
        auVar26 = vpmulld_avx512f(auVar41,ZEXT3264(auVar18));
        auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        uVar50 = auVar3._0_4_;
        if (uVar50 != (dEdxi->d).d[0]) goto LAB_0034cc00;
      }
      pptVar12 = (type **)(long)(int)uVar50;
    }
    local_160.m_data = dEdxi->v;
    local_160.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(int)(dEdxi->d).bd;
    local_98 = (float *)((ulong)uVar48 | 0x100000000);
    local_b0._M_elems[0] = (_Type)(_Type)local_120[0];
    local_40.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)&local_e8;
    local_160.m_dimensions.super_array<long,_2>._M_elems[0] = (long)pptVar12;
    local_e8 = (type *)local_160.m_data;
    alStack_e0[0] = (long)pptVar12;
    local_d8 = (DefaultDevice *)local_160.m_dimensions.super_array<long,_2>._M_elems[1];
    local_d0 = fx->v;
    local_c8._M_elems[0] = (_Type)(_Type)alVar13[0];
    local_c0 = (type *)(long)(int)(fx->d).bd;
    local_40.m_data = (StoragePointerType)&local_160;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
           *)&local_40,local_f0->edevice);
LAB_0034cb2c:
    std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~vector
              ((vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> *)local_118);
    return;
  }
  uVar48 = (fx->d).nd;
  if ((ulong)uVar48 == 0) {
    numValuesToReduce._M_elems[0] = (_Type)1;
    if ((fx->d).d[0] != 1) goto LAB_0034cb46;
  }
  else {
    if (uVar48 == 1) {
      uVar48 = (fx->d).d[0];
    }
    else {
      auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar29 = vpbroadcastq_avx512f();
      uVar9 = 0;
      do {
        auVar30 = vpbroadcastq_avx512f();
        auVar31 = vmovdqa64_avx512f(auVar26);
        auVar26 = vporq_avx512f(auVar30,auVar27);
        auVar30 = vporq_avx512f(auVar30,auVar28);
        uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
        bVar6 = (byte)uVar5;
        uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
        bVar7 = (byte)uVar5;
        uVar17 = CONCAT11(bVar7,bVar6);
        auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar9));
        auVar19._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
        auVar19._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
        auVar19._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
        auVar19._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
        auVar19._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
        auVar19._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
        auVar19._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
        auVar19._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
        auVar19._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
        auVar19._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
        auVar19._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
        auVar19._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
        auVar19._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
        auVar19._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
        auVar19._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
        auVar19._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
        uVar9 = uVar9 + 0x10;
        auVar26 = vpmulld_avx512f(auVar19,auVar31);
      } while (((ulong)uVar48 + 0xf & 0x1fffffff0) != uVar9);
      auVar26 = vmovdqa32_avx512f(auVar26);
      auVar20._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_;
      bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar20._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
      bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar20._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
      bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar20._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
      bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
      auVar20._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
      bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
      auVar20._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
      bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
      auVar20._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
      bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
      auVar20._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
      auVar20._32_4_ =
           (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
      bVar2 = (bool)(bVar7 >> 1 & 1);
      auVar20._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
      bVar2 = (bool)(bVar7 >> 2 & 1);
      auVar20._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
      bVar2 = (bool)(bVar7 >> 3 & 1);
      auVar20._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
      bVar2 = (bool)(bVar7 >> 4 & 1);
      auVar20._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
      bVar2 = (bool)(bVar7 >> 5 & 1);
      auVar20._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
      bVar2 = (bool)(bVar7 >> 6 & 1);
      auVar20._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
      auVar20._60_4_ =
           (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
      auVar18 = vextracti64x4_avx512f(auVar20,1);
      auVar26 = vpmulld_avx512f(auVar20,ZEXT3264(auVar18));
      auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      auVar4 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      uVar48 = auVar3._0_4_;
      if (uVar48 != (fx->d).d[0]) goto LAB_0034cb46;
    }
    numValuesToReduce._M_elems[0] = (_Type)(long)(int)uVar48;
  }
  if ((dEdf->d).bd != 1) goto LAB_0034cb46;
  uVar48 = (dEdf->d).nd;
  if ((ulong)uVar48 == 0) {
    aVar11._M_elems[0] = (_Type)1;
    if ((dEdf->d).d[0] != 1) goto LAB_0034cb46;
  }
  else {
    if (uVar48 == 1) {
      uVar48 = (dEdf->d).d[0];
    }
    else {
      auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar29 = vpbroadcastq_avx512f();
      uVar9 = 0;
      do {
        auVar30 = vpbroadcastq_avx512f();
        auVar31 = vmovdqa64_avx512f(auVar26);
        auVar26 = vporq_avx512f(auVar30,auVar27);
        auVar30 = vporq_avx512f(auVar30,auVar28);
        uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
        bVar6 = (byte)uVar5;
        uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
        bVar7 = (byte)uVar5;
        uVar17 = CONCAT11(bVar7,bVar6);
        auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar9));
        auVar24._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
        auVar24._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
        auVar24._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
        auVar24._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
        auVar24._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
        auVar24._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
        auVar24._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
        auVar24._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
        auVar24._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
        auVar24._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
        auVar24._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
        auVar24._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
        auVar24._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
        auVar24._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
        auVar24._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
        auVar24._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
        uVar9 = uVar9 + 0x10;
        auVar26 = vpmulld_avx512f(auVar24,auVar31);
      } while (((ulong)uVar48 + 0xf & 0x1fffffff0) != uVar9);
      auVar26 = vmovdqa32_avx512f(auVar26);
      auVar25._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_;
      bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
      bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar25._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
      bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar25._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
      bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
      auVar25._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
      bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
      auVar25._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
      bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
      auVar25._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
      bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
      auVar25._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
      auVar25._32_4_ =
           (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
      bVar2 = (bool)(bVar7 >> 1 & 1);
      auVar25._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
      bVar2 = (bool)(bVar7 >> 2 & 1);
      auVar25._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
      bVar2 = (bool)(bVar7 >> 3 & 1);
      auVar25._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
      bVar2 = (bool)(bVar7 >> 4 & 1);
      auVar25._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
      bVar2 = (bool)(bVar7 >> 5 & 1);
      auVar25._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
      bVar2 = (bool)(bVar7 >> 6 & 1);
      auVar25._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
      auVar25._60_4_ =
           (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
      auVar18 = vextracti64x4_avx512f(auVar25,1);
      auVar26 = vpmulld_avx512f(auVar25,ZEXT3264(auVar18));
      auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      auVar4 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      uVar48 = auVar3._0_4_;
      if (uVar48 != (dEdf->d).d[0]) goto LAB_0034cb46;
    }
    aVar11._M_elems[0] = (_Type)(long)(int)uVar48;
  }
  if (local_128 == 1) {
    local_78 = dEdf->v;
    auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = vpbroadcastq_avx512f();
    lVar15 = 0;
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vmovdqa64_avx512f(auVar26);
      auVar26 = vporq_avx512f(auVar30,auVar27);
      auVar30 = vporq_avx512f(auVar30,auVar28);
      uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
      bVar7 = (byte)uVar5;
      uVar17 = CONCAT11(bVar7,bVar6);
      auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_148 + lVar15));
      auVar32._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
      auVar32._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
      auVar32._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
      auVar32._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
      auVar32._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
      auVar32._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
      auVar32._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
      auVar32._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
      auVar32._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
      auVar32._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
      auVar32._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
      auVar32._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
      auVar32._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
      auVar32._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
      auVar32._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
      auVar32._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
      lVar15 = lVar15 + 0x10;
      auVar26 = vpmulld_avx512f(auVar32,auVar31);
    } while (lVar15 != 0x10);
    auVar26 = vmovdqa32_avx512f(auVar26);
    auVar33._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_;
    bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar33._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
    bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar33._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
    bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar33._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
    bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar33._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
    bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar33._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
    bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar33._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
    bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
    auVar33._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
    auVar33._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar33._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar33._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar33._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar33._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar33._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar33._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
    auVar33._60_4_ =
         (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
    auVar18 = vextracti64x4_avx512f(auVar33,1);
    auVar26 = vpmulld_avx512f(auVar33,ZEXT3264(auVar18));
    auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    if (auVar3._0_4_ == 1) {
      local_d8 = dev->edevice;
      local_e8 = (type *)local_120[0];
      local_a0 = local_d8;
      local_90 = fx->v;
      local_88.super_array<long,_1>._M_elems[0] =
           (array<long,_1>)(array<long,_1>)numValuesToReduce._M_elems[0];
      local_80 = local_d8;
      local_70.super_array<long,_1>._M_elems[0] = (array<long,_1>)(array<long,_1>)aVar11._M_elems[0]
      ;
      local_68 = local_d8;
      if (numValuesToReduce._M_elems[0] != aVar11._M_elems[0]) {
        __assert_fail("dimensions_match(m_leftImpl.dimensions(), m_rightImpl.dimensions())",
                      "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",
                      0x244,
                      "Eigen::TensorEvaluator<const Eigen::TensorCwiseBinaryOp<dynet::FWeightedError, const Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Eigen::DefaultDevice>::TensorEvaluator(const XprType &, const Device &) [Derived = const Eigen::TensorCwiseBinaryOp<dynet::FWeightedError, const Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Device = Eigen::DefaultDevice]"
                     );
      }
      local_58 = (EvaluatorPointerType)0x0;
      local_d0 = (float *)CONCAT71(local_d0._1_7_,1);
      local_b0._M_elems[0] = (_Type)1;
      local_c8._M_elems[0] = numValuesToReduce._M_elems[0];
      local_b8[0] = numValuesToReduce._M_elems[0];
      local_a8._M_elems[0] = numValuesToReduce._M_elems[0];
      local_50 = local_d8;
      CVar49 = Eigen::internal::
               InnerMostDimReducer<Eigen::TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>,_Eigen::internal::SumReducer<float>,_false,_true>
               ::reduce((TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                         *)&local_d0,0,(Index)numValuesToReduce._M_elems[0],
                        (SumReducer<float> *)&local_160);
      if (local_e8 == (type *)0x0) {
        __assert_fail("m_data != __null",
                      "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",100
                      ,
                      "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 0>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 0>>, Device = Eigen::DefaultDevice]"
                     );
      }
      *(CoeffReturnType *)&local_e8->m_data = CVar49;
      if (local_58 != (EvaluatorPointerType)0x0) {
        free(*(void **)(local_58 + -2));
      }
      if ((fx->d).bd == 1) {
        uVar48 = (fx->d).d[0];
        uVar50 = (fx->d).nd;
        if ((ulong)uVar50 == 0) {
          pfVar8 = (float *)0x1;
          if (uVar48 != 1) goto LAB_0034cb46;
        }
        else {
          if (uVar50 != 1) {
            auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar29 = vpbroadcastq_avx512f();
            uVar9 = 0;
            do {
              auVar30 = vpbroadcastq_avx512f();
              auVar31 = vmovdqa64_avx512f(auVar26);
              auVar26 = vporq_avx512f(auVar30,auVar27);
              auVar30 = vporq_avx512f(auVar30,auVar28);
              uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
              bVar6 = (byte)uVar5;
              uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
              bVar7 = (byte)uVar5;
              uVar17 = CONCAT11(bVar7,bVar6);
              auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar9));
              auVar34._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
              auVar34._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
              auVar34._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
              auVar34._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
              auVar34._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
              auVar34._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
              auVar34._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
              auVar34._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
              auVar34._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
              auVar34._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
              auVar34._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
              auVar34._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
              auVar34._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
              auVar34._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
              auVar34._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
              auVar34._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
              uVar9 = uVar9 + 0x10;
              auVar26 = vpmulld_avx512f(auVar34,auVar31);
            } while (((ulong)uVar50 + 0xf & 0x1fffffff0) != uVar9);
            auVar26 = vmovdqa32_avx512f(auVar26);
            auVar35._0_4_ =
                 (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_;
            bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar35._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
            bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar35._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
            bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar35._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
            bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
            auVar35._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
            bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
            auVar35._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
            bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
            auVar35._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
            bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
            auVar35._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
            auVar35._32_4_ =
                 (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
            bVar2 = (bool)(bVar7 >> 1 & 1);
            auVar35._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
            bVar2 = (bool)(bVar7 >> 2 & 1);
            auVar35._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
            bVar2 = (bool)(bVar7 >> 3 & 1);
            auVar35._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
            bVar2 = (bool)(bVar7 >> 4 & 1);
            auVar35._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
            bVar2 = (bool)(bVar7 >> 5 & 1);
            auVar35._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
            bVar2 = (bool)(bVar7 >> 6 & 1);
            auVar35._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
            auVar35._60_4_ =
                 (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
            auVar18 = vextracti64x4_avx512f(auVar35,1);
            auVar26 = vpmulld_avx512f(auVar35,ZEXT3264(auVar18));
            auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
            auVar4 = vpshufd_avx(auVar3,0xee);
            auVar3 = vpmulld_avx(auVar3,auVar4);
            auVar4 = vpshufd_avx(auVar3,0x55);
            auVar3 = vpmulld_avx(auVar3,auVar4);
            if (auVar3._0_4_ != uVar48) goto LAB_0034cb46;
          }
          pfVar8 = (float *)(long)(int)uVar48;
        }
        if (local_128 == 1) {
          if ((ulong)local_12c == 0) {
            IVar14 = 1;
            if (local_148[0] != 1) goto LAB_0034cb68;
          }
          else {
            iVar10 = local_148[0];
            if (local_12c != 1) {
              auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
              auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar29 = vpbroadcastq_avx512f();
              uVar9 = 0;
              do {
                auVar30 = vpbroadcastq_avx512f();
                auVar31 = vmovdqa64_avx512f(auVar26);
                auVar26 = vporq_avx512f(auVar30,auVar27);
                auVar30 = vporq_avx512f(auVar30,auVar28);
                uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
                bVar6 = (byte)uVar5;
                uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
                bVar7 = (byte)uVar5;
                uVar17 = CONCAT11(bVar7,bVar6);
                auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_148 + uVar9));
                auVar42._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
                auVar42._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
                auVar42._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
                auVar42._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
                auVar42._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
                auVar42._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
                auVar42._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
                auVar42._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
                auVar42._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
                auVar42._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
                auVar42._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
                auVar42._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
                auVar42._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
                auVar42._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
                auVar42._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
                auVar42._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
                uVar9 = uVar9 + 0x10;
                auVar26 = vpmulld_avx512f(auVar42,auVar31);
              } while (((ulong)local_12c + 0xf & 0x1fffffff0) != uVar9);
              auVar26 = vmovdqa32_avx512f(auVar26);
              auVar43._0_4_ =
                   (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_;
              bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
              auVar43._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
              bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
              auVar43._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
              bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
              auVar43._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
              bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
              auVar43._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
              bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
              auVar43._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
              bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
              auVar43._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
              bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
              auVar43._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
              auVar43._32_4_ =
                   (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
              bVar2 = (bool)(bVar7 >> 1 & 1);
              auVar43._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
              bVar2 = (bool)(bVar7 >> 2 & 1);
              auVar43._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
              bVar2 = (bool)(bVar7 >> 3 & 1);
              auVar43._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
              bVar2 = (bool)(bVar7 >> 4 & 1);
              auVar43._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
              bVar2 = (bool)(bVar7 >> 5 & 1);
              auVar43._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
              bVar2 = (bool)(bVar7 >> 6 & 1);
              auVar43._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
              auVar43._60_4_ =
                   (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
              auVar18 = vextracti64x4_avx512f(auVar43,1);
              auVar26 = vpmulld_avx512f(auVar43,ZEXT3264(auVar18));
              auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
              auVar4 = vpshufd_avx(auVar3,0xee);
              auVar3 = vpmulld_avx(auVar3,auVar4);
              auVar4 = vpshufd_avx(auVar3,0x55);
              auVar3 = vpmulld_avx(auVar3,auVar4);
              iVar10 = auVar3._0_4_;
              if (auVar3._0_4_ != local_148[0]) goto LAB_0034cb68;
            }
            IVar14 = (Index)iVar10;
          }
          if ((dEdf->d).bd != 1) goto LAB_0034cb46;
          uVar50 = (dEdf->d).nd;
          if ((ulong)uVar50 == 0) {
            pfVar16 = (float *)0x1;
            if ((dEdf->d).d[0] != 1) goto LAB_0034cb46;
          }
          else {
            if (uVar50 == 1) {
              uVar50 = (dEdf->d).d[0];
            }
            else {
              auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
              auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar29 = vpbroadcastq_avx512f();
              uVar9 = 0;
              do {
                auVar30 = vpbroadcastq_avx512f();
                auVar31 = vmovdqa64_avx512f(auVar26);
                auVar26 = vporq_avx512f(auVar30,auVar27);
                auVar30 = vporq_avx512f(auVar30,auVar28);
                uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
                bVar6 = (byte)uVar5;
                uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
                bVar7 = (byte)uVar5;
                uVar17 = CONCAT11(bVar7,bVar6);
                auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar9));
                auVar44._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
                auVar44._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
                auVar44._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
                auVar44._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
                auVar44._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
                auVar44._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
                auVar44._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
                auVar44._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
                auVar44._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
                auVar44._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
                auVar44._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
                auVar44._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
                auVar44._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
                auVar44._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
                auVar44._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
                auVar44._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
                uVar9 = uVar9 + 0x10;
                auVar26 = vpmulld_avx512f(auVar44,auVar31);
              } while (((ulong)uVar50 + 0xf & 0x1fffffff0) != uVar9);
              auVar26 = vmovdqa32_avx512f(auVar26);
              auVar45._0_4_ =
                   (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_;
              bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
              auVar45._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
              bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
              auVar45._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
              bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
              auVar45._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
              bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
              auVar45._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
              bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
              auVar45._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
              bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
              auVar45._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
              bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
              auVar45._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
              auVar45._32_4_ =
                   (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
              bVar2 = (bool)(bVar7 >> 1 & 1);
              auVar45._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
              bVar2 = (bool)(bVar7 >> 2 & 1);
              auVar45._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
              bVar2 = (bool)(bVar7 >> 3 & 1);
              auVar45._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
              bVar2 = (bool)(bVar7 >> 4 & 1);
              auVar45._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
              bVar2 = (bool)(bVar7 >> 5 & 1);
              auVar45._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
              bVar2 = (bool)(bVar7 >> 6 & 1);
              auVar45._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
              auVar45._60_4_ =
                   (uint)(bVar7 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
              auVar18 = vextracti64x4_avx512f(auVar45,1);
              auVar26 = vpmulld_avx512f(auVar45,ZEXT3264(auVar18));
              auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
              auVar4 = vpshufd_avx(auVar3,0xee);
              auVar3 = vpmulld_avx(auVar3,auVar4);
              auVar4 = vpshufd_avx(auVar3,0x55);
              auVar3 = vpmulld_avx(auVar3,auVar4);
              uVar50 = auVar3._0_4_;
              if (uVar50 != (dEdf->d).d[0]) goto LAB_0034cb46;
            }
            pfVar16 = (float *)(long)(int)uVar50;
          }
          if ((dEdxi->d).bd == 1) {
            local_98 = dEdf->v;
            uVar50 = (dEdxi->d).nd;
            if ((ulong)uVar50 == 0) {
              alStack_e0[0] = 1;
              if ((dEdxi->d).d[0] != 1) goto LAB_0034cb68;
            }
            else {
              if (uVar50 == 1) {
                uVar50 = (dEdxi->d).d[0];
              }
              else {
                auVar26 = vpbroadcastd_avx512f(ZEXT416(1));
                auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                auVar29 = vpbroadcastq_avx512f();
                uVar9 = 0;
                do {
                  auVar30 = vpbroadcastq_avx512f();
                  auVar31 = vmovdqa64_avx512f(auVar26);
                  auVar26 = vporq_avx512f(auVar30,auVar27);
                  auVar30 = vporq_avx512f(auVar30,auVar28);
                  uVar5 = vpcmpuq_avx512f(auVar30,auVar29,2);
                  bVar6 = (byte)uVar5;
                  uVar5 = vpcmpuq_avx512f(auVar26,auVar29,2);
                  bVar7 = (byte)uVar5;
                  uVar17 = CONCAT11(bVar7,bVar6);
                  auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar9));
                  auVar46._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar26._4_4_;
                  auVar46._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_;
                  auVar46._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar26._8_4_;
                  auVar46._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar26._12_4_;
                  auVar46._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar26._16_4_;
                  auVar46._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar26._20_4_;
                  auVar46._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar26._24_4_;
                  auVar46._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar26._28_4_;
                  auVar46._32_4_ = (uint)(bVar7 & 1) * auVar26._32_4_;
                  auVar46._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar26._36_4_;
                  auVar46._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar26._40_4_;
                  auVar46._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar26._44_4_;
                  auVar46._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar26._48_4_;
                  auVar46._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar26._52_4_;
                  auVar46._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar26._56_4_;
                  auVar46._60_4_ = (uint)(bVar7 >> 7) * auVar26._60_4_;
                  uVar9 = uVar9 + 0x10;
                  auVar26 = vpmulld_avx512f(auVar46,auVar31);
                } while (((ulong)uVar50 + 0xf & 0x1fffffff0) != uVar9);
                auVar26 = vmovdqa32_avx512f(auVar26);
                auVar47._0_4_ =
                     (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar31._0_4_;
                bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * auVar31._4_4_;
                bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * auVar31._8_4_;
                bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
                auVar47._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * auVar31._12_4_;
                bVar2 = (bool)((byte)(uVar17 >> 4) & 1);
                auVar47._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * auVar31._16_4_;
                bVar2 = (bool)((byte)(uVar17 >> 5) & 1);
                auVar47._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * auVar31._20_4_;
                bVar2 = (bool)((byte)(uVar17 >> 6) & 1);
                auVar47._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * auVar31._24_4_;
                bVar2 = (bool)((byte)(uVar17 >> 7) & 1);
                auVar47._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * auVar31._28_4_;
                auVar47._32_4_ =
                     (uint)(bVar7 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar31._32_4_;
                bVar2 = (bool)(bVar7 >> 1 & 1);
                auVar47._36_4_ = (uint)bVar2 * auVar26._36_4_ | (uint)!bVar2 * auVar31._36_4_;
                bVar2 = (bool)(bVar7 >> 2 & 1);
                auVar47._40_4_ = (uint)bVar2 * auVar26._40_4_ | (uint)!bVar2 * auVar31._40_4_;
                bVar2 = (bool)(bVar7 >> 3 & 1);
                auVar47._44_4_ = (uint)bVar2 * auVar26._44_4_ | (uint)!bVar2 * auVar31._44_4_;
                bVar2 = (bool)(bVar7 >> 4 & 1);
                auVar47._48_4_ = (uint)bVar2 * auVar26._48_4_ | (uint)!bVar2 * auVar31._48_4_;
                bVar2 = (bool)(bVar7 >> 5 & 1);
                auVar47._52_4_ = (uint)bVar2 * auVar26._52_4_ | (uint)!bVar2 * auVar31._52_4_;
                bVar2 = (bool)(bVar7 >> 6 & 1);
                auVar47._56_4_ = (uint)bVar2 * auVar26._56_4_ | (uint)!bVar2 * auVar31._56_4_;
                auVar47._60_4_ =
                     (uint)(bVar7 >> 7) * auVar26._60_4_ |
                     (uint)!(bool)(bVar7 >> 7) * auVar31._60_4_;
                auVar18 = vextracti64x4_avx512f(auVar47,1);
                auVar26 = vpmulld_avx512f(auVar47,ZEXT3264(auVar18));
                auVar3 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
                auVar4 = vpshufd_avx(auVar3,0xee);
                auVar3 = vpmulld_avx(auVar3,auVar4);
                auVar4 = vpshufd_avx(auVar3,0x55);
                auVar3 = vpmulld_avx(auVar3,auVar4);
                uVar50 = auVar3._0_4_;
                if (uVar50 != (dEdxi->d).d[0]) goto LAB_0034cb68;
              }
              alStack_e0[0] = (long)(int)uVar50;
            }
            local_e8 = (type *)dEdxi->v;
            local_160.m_data = (StoragePointerType)&local_40;
            local_160.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_e8;
            local_c0 = (type *)local_120[0];
            local_b0._M_elems[0]._0_4_ = uVar48;
            local_d8 = (DefaultDevice *)fx->v;
            local_d0 = pfVar8;
            local_b8[0] = IVar14;
            local_90 = pfVar16;
            local_40.m_data = (StoragePointerType)local_e8;
            local_40.m_dimensions.super_array<long,_1>._M_elems[0] =
                 (array<long,_1>)(array<long,_1>)alStack_e0[0];
            Eigen::internal::
            TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
            ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
                   *)&local_160,dev->edevice);
            goto LAB_0034cb2c;
          }
        }
LAB_0034cb68:
        __assert_fail("d.batch_elems() == 1 && (d.ndims() == 1 || d.size() == d.rows())",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                      ,0xb6,"Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::t()");
      }
LAB_0034cb46:
      __assert_fail("d.batch_elems() == 1 && (d.ndims() == 1 || d.size() == d.rows())",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                    ,0xba,"const Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::t() const"
                   );
    }
  }
  __assert_fail("d.batch_elems() == 1 && d.size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                ,0xae,"Eigen::TensorMap<Eigen::Tensor<float, 0>> dynet::Tensor::t()");
}

Assistant:

void LogSoftmax::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  if (xs[0]->d.cols() != 1) 
    throw std::runtime_error("LogSoftmax::backward not yet implemented for multiple columns");
  Tensor z(Dim({1},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  if(fx.d.bd == 1) {
    z.t<0>().device(*dev.edevice) = fx.t<1>().binaryExpr(dEdf.t<1>(), FWeightedError()).sum();
    Eigen::array<int, 1> bcast; bcast[0] = fx.d.rows();
    dEdxi.t<1>().device(*dev.edevice) += fx.t<1>().exp() * -z.t<1>().broadcast(bcast) + dEdf.t<1>();
  } else {
    Eigen::array<int, 1> red_axis; red_axis[0] = 0;
    z.tb<0>().device(*dev.edevice) = (fx.tb<1>().binaryExpr(dEdf.tb<1>(), FWeightedError())).sum(red_axis);
    Eigen::array<int, 2> bcast; bcast[0] = fx.d.rows(); bcast[1] = 1;
    dEdxi.tb<1>().device(*dev.edevice) += fx.tb<1>().exp() * -z.tb<1>().broadcast(bcast) + dEdf.tb<1>();
  }
}